

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_indexed(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  uintptr_t uVar2;
  uint uVar3;
  uintptr_t o_19;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  TCGv_i64 pTVar6;
  TCGTemp *pTVar7;
  uint uVar8;
  int iVar9;
  TCGv_ptr a2;
  _Bool is_f16;
  ARMISARegisters *pAVar10;
  DisasContext_conflict1 *pDVar11;
  bool bVar12;
  uint element;
  uintptr_t o_1;
  long lVar13;
  TCGv_i64 pTVar14;
  TCGOpcode opc;
  undefined4 in_register_00000034;
  TCGContext_conflict1 *pTVar15;
  undefined1 *a3;
  uint uVar16;
  undefined4 uVar17;
  uint uVar18;
  code *pcVar19;
  undefined4 uVar20;
  undefined8 in_R11;
  undefined7 uVar21;
  uint srcidx;
  uintptr_t o_11;
  ulong uVar22;
  TCGv_i32 tcg_dest;
  undefined1 *puVar23;
  uint uVar24;
  uintptr_t o_3;
  long lVar25;
  uint uVar26;
  uint uVar27;
  MemOp memop;
  uintptr_t o;
  TCGv_i32 pTVar28;
  ulong uVar29;
  byte bVar30;
  byte bVar31;
  uint uVar32;
  uintptr_t o_16;
  TCGv_i64 *ppTVar33;
  bool bVar34;
  TCGTemp *local_e8;
  TCGTemp *local_e0;
  TCGTemp *local_d8;
  TCGTemp *local_d0;
  undefined8 local_c8;
  TCGTemp *local_c0;
  DisasContext_conflict1 *local_b8;
  ulong local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  TCGTemp *local_98;
  undefined8 local_90;
  code *local_88;
  uintptr_t o_10;
  TCGTemp *local_78;
  undefined8 local_70;
  TCGv_ptr local_68;
  ulong local_60;
  TCGv_i64 tcg_res [2];
  
  uVar32 = insn & 0x20000000;
  uVar24 = insn >> 0xc & 0xf;
  uVar26 = uVar32 >> 0x19;
  uVar27 = uVar26 | uVar24;
  if (0x1f < uVar27) goto switchD_006a8f75_caseD_f;
  pTVar1 = s->uc->tcg_ctx;
  uVar18 = insn & 0x40000000;
  uVar16 = insn >> 0x16 & 3;
  uVar29 = (ulong)uVar16;
  uVar8 = insn >> 0x15 & 1;
  uVar3 = insn >> 0x14 & 1;
  srcidx = insn >> 0x10 & 0xf;
  element = insn >> 0xb & 1;
  uVar21 = (undefined7)((ulong)in_R11 >> 8);
  switch(uVar27) {
  case 0:
  case 4:
  case 0x18:
  case 0x1c:
    uVar16 = uVar16 ^ 2 | insn & 0x10000000;
    uVar29 = (ulong)uVar16;
    if ((uVar16 != 0) || ((s->isar->id_aa64isar0 & 0xf000000000000) == 0))
    goto switchD_006a8f75_caseD_f;
    bVar30 = 1;
    uVar20 = 0;
    is_f16 = false;
    goto LAB_006a90d9;
  case 1:
  case 5:
  case 9:
  case 0x19:
    if (uVar16 - 2 < 2) {
      is_f16 = false;
    }
    else {
      if (uVar16 == 1) goto switchD_006a8f75_caseD_f;
      pAVar10 = s->isar;
      uVar29 = 1;
LAB_006a909f:
      if ((pAVar10->id_aa64pfr0 & 0xf0000) != 0x10000) goto switchD_006a8f75_caseD_f;
      is_f16 = true;
    }
    bVar30 = 0;
    uVar20 = 0;
    goto LAB_006a90c3;
  default:
    uVar20 = (undefined4)CONCAT71(uVar21,1);
    if ((insn >> 0x1c & 1) != 0) goto switchD_006a8f75_caseD_f;
    goto LAB_006a906e;
  case 3:
  case 7:
  case 0xb:
    uVar20 = (undefined4)CONCAT71(uVar21,1);
    goto LAB_006a906e;
  case 8:
  case 0x10:
  case 0x14:
    if ((insn >> 0x1c & 1) != 0) goto switchD_006a8f75_caseD_f;
    break;
  case 0xc:
  case 0xd:
    break;
  case 0xe:
  case 0x1e:
    if ((uVar16 != 2 || (insn & 0x10000000) != 0) || ((s->isar->id_aa64isar0 & 0xf00000000000) == 0)
       ) goto switchD_006a8f75_caseD_f;
    bVar30 = 1;
    uVar20 = 0;
    is_f16 = false;
    goto LAB_006a9101;
  case 0xf:
  case 0x1b:
    goto switchD_006a8f75_caseD_f;
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x17:
    if (((insn >> 0x1c & 1) != 0) || (pAVar10 = s->isar, (pAVar10->id_aa64isar1 & 0xf0000) == 0))
    goto switchD_006a8f75_caseD_f;
    if (uVar16 != 2) {
      if ((uVar16 != 1) || (uVar29 = 2, element != 0 && uVar18 == 0)) goto switchD_006a8f75_caseD_f;
      goto LAB_006a909f;
    }
    uVar20 = 0;
    bVar30 = 0;
    is_f16 = false;
    goto LAB_006a9136;
  case 0x1d:
  case 0x1f:
    if ((s->isar->id_aa64isar0 & 0xf0000000) == 0) goto switchD_006a8f75_caseD_f;
  }
  uVar20 = 0;
LAB_006a906e:
  if ((uVar16 == 3) || (uVar16 == 0)) {
switchD_006a8f75_caseD_f:
    unallocated_encoding_aarch64(s);
    return;
  }
  bVar30 = 1;
  is_f16 = false;
LAB_006a90c3:
  iVar9 = (int)uVar29;
  if (iVar9 == 3) {
LAB_006a9136:
    if (uVar18 == 0 || uVar8 != 0) goto switchD_006a8f75_caseD_f;
    srcidx = uVar3 << 4 | srcidx;
    local_78 = (TCGTemp *)0x3;
    bVar34 = true;
    uVar17 = 0;
    local_c8 = (TCGTemp *)((ulong)local_c8._4_4_ << 0x20);
    local_88 = gen_helper_gvec_fcmlas_idx;
  }
  else if (iVar9 == 2) {
LAB_006a9101:
    element = uVar8 + element * 2;
    srcidx = srcidx | uVar3 << 4;
    local_78 = (TCGTemp *)&DAT_00000002;
    local_c8 = (TCGTemp *)CONCAT44(local_c8._4_4_,1);
    local_88 = gen_helper_gvec_fcmlah_idx;
    bVar34 = false;
    uVar17 = 0;
  }
  else {
    if (iVar9 != 1) {
      iVar9 = 0x343f;
LAB_006aa79e:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,iVar9,(char *)0x0);
    }
LAB_006a90d9:
    element = uVar8 * 2 + element * 4 | uVar3;
    local_78 = (TCGTemp *)&DAT_00000001;
    uVar17 = (undefined4)CONCAT71((int7)(uVar29 >> 8),1);
    local_88 = gen_helper_gvec_fcmlah_idx;
    bVar34 = false;
    local_c8 = (TCGTemp *)((ulong)local_c8 & 0xffffffff00000000);
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  local_a0 = (ulong)(insn >> 5);
  o_10 = CONCAT44(o_10._4_4_,uVar17);
  local_70 = CONCAT44(local_70._4_4_,uVar20);
  local_b0 = CONCAT44(in_register_00000034,insn);
  if (bVar30 == 0) {
    local_90 = (TCGTemp *)(CONCAT44(local_90._4_4_,insn) & 0xffffffff40000000);
    local_68 = get_fpstatus_ptr_aarch64(pTVar1,is_f16);
    uVar18 = (uint)local_90;
  }
  else {
    local_68 = (TCGv_ptr)0x0;
  }
  uVar3 = (uint)local_a0 & 0x1f;
  local_a0 = (ulong)uVar3;
  uVar8 = (uint)local_b0;
  local_a8 = CONCAT44(local_a8._4_4_,uVar8) & 0xffffffff0000001f;
  if (uVar27 < 0x1f) {
    if ((0xaa0000U >> (uVar26 | uVar24) & 1) != 0) {
      tcg_gen_gvec_3_ptr_aarch64
                (pTVar1,(int)local_a8 * 0x100 + 0xc10,uVar3 * 0x100 + 0xc10,srcidx * 0x100 + 0xc10,
                 local_68,(uint)(uVar18 != 0) * 8 + 8,s->sve_len,(uVar8 >> 0xd & 3) + element * 4,
                 local_88);
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(local_68 + (long)pTVar1));
      return;
    }
    if ((0x11000011U >> (uVar26 | uVar24) & 1) != 0) {
      tcg_gen_gvec_3_ptr_aarch64
                (pTVar1,(int)local_a8 * 0x100 + 0xc10,uVar3 * 0x100 + 0xc10,srcidx * 0x100 + 0xc10,
                 pTVar1->cpu_env,(uint)(uVar18 != 0) * 8 + 8,s->sve_len,
                 (uVar32 >> 0x1c) + element * 4 | uVar8 >> 0xe & 1,gen_helper_gvec_fmlal_idx_a64);
      return;
    }
    if ((0x40004000U >> (uVar26 | uVar24) & 1) != 0) {
      pcVar19 = gen_helper_gvec_udot_idx_b;
      if (uVar32 == 0) {
        pcVar19 = gen_helper_gvec_sdot_idx_b;
      }
      tcg_gen_gvec_3_ool_aarch64
                (s->uc->tcg_ctx,(int)local_a8 * 0x100 + 0xc10,uVar3 * 0x100 + 0xc10,
                 srcidx * 0x100 + 0xc10,(uint)(uVar18 != 0) * 8 + 8,s->sve_len,element,pcVar19);
      return;
    }
  }
  local_b8 = s;
  if (bVar34) {
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
    if ((byte)((byte)local_70 | bVar30 | uVar18 == 0) == 1) {
      __assert_fail("is_fp && is_q && !is_long",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x347a,"void disas_simd_indexed(DisasContext *, uint32_t)");
    }
    pTVar15 = local_b8->uc->tcg_ctx;
    local_c8 = pTVar4;
    tcg_gen_op3_aarch64(pTVar15,INDEX_op_ld_i64,((long)pTVar4 - (long)pTVar1) + (long)pTVar15,
                        (TCGArg)(pTVar15->cpu_env + (long)pTVar15),
                        (ulong)(srcidx * 0x100 + element * 8 + 0xc10));
    local_a0 = (ulong)(uint)((int)local_a0 << 8);
    uVar24 = (uVar27 - 1) * 0x40000000 | uVar27 - 1 >> 2;
    local_90 = (TCGTemp *)(local_68 + (long)pTVar1);
    uVar29 = (ulong)((int)local_a8 * 0x100 + 0xc10);
    bVar30 = 0;
    o_10 = (uintptr_t)uVar24;
    uVar22 = 0;
    do {
      pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
      lVar13 = (long)pTVar4 - (long)pTVar1;
      pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
      pTVar15 = local_b8->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar15,INDEX_op_ld_i64,(long)pTVar15 + lVar13,
                          (TCGArg)(pTVar15->cpu_env + (long)pTVar15),local_a0 + uVar22 + 0xc10);
      if (6 < uVar24) {
switchD_006a952d_caseD_6aa792:
        iVar9 = 0x3494;
        goto LAB_006aa79e;
      }
      lVar25 = (long)pTVar4 - (long)pTVar1;
      switch((long)&switchD_006a952d::switchdataD_00d78cd8 +
             (long)(int)(&switchD_006a952d::switchdataD_00d78cd8)[o_10]) {
      case 0x6a952f:
        local_e8 = (TCGTemp *)((long)pTVar1 + lVar13);
        tcg_gen_callN_aarch64(pTVar1,helper_vfp_negd_aarch64,local_e8,1,&local_e8);
      case 0x6a9556:
        pTVar15 = local_b8->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar15,INDEX_op_ld_i64,(long)pTVar15 + lVar25,
                            (TCGArg)(pTVar15->cpu_env + (long)pTVar15),uVar22 | uVar29);
        local_e8 = (TCGTemp *)((long)pTVar1 + lVar13);
        local_e0 = local_c8;
        local_d8 = (TCGTemp *)((long)pTVar1 + lVar25);
        local_d0 = local_90;
        tcg_gen_callN_aarch64(pTVar1,helper_vfp_muladdd_aarch64,local_d8,4,&local_e8);
        goto LAB_006a9645;
      case 0x6a95d4:
        pcVar19 = helper_vfp_muld_aarch64;
        break;
      case 0x6a9601:
        pcVar19 = helper_vfp_mulxd_aarch64;
        break;
      case 0x6aa792:
        goto switchD_006a952d_caseD_6aa792;
      }
      local_e8 = (TCGTemp *)((long)pTVar1 + lVar13);
      local_d8 = local_90;
      local_e0 = local_c8;
      tcg_gen_callN_aarch64(pTVar1,pcVar19,(TCGTemp *)((long)pTVar1 + lVar25),3,&local_e8);
LAB_006a9645:
      uVar26 = (uint)local_b0 >> 0x1c;
      pTVar15 = local_b8->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar15,INDEX_op_st_i64,(long)pTVar15 + lVar25,
                          (TCGArg)(pTVar15->cpu_env + (long)pTVar15),uVar22 | uVar29);
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar13 + (long)pTVar1));
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(lVar25 + (long)pTVar1));
      bVar31 = bVar30 ^ 1;
      uVar22 = 8;
      bVar30 = 1;
    } while ((bool)((uVar26 & 1) == 0 & bVar31));
    bVar34 = ((uint)local_b0 >> 0x1c & 1) == 0;
    pTVar4 = local_c8;
  }
  else {
    if ((char)local_70 != '\0') {
      o_10 = CONCAT44(o_10._4_4_,uVar8) & 0xffffffff20001000;
      if ((char)local_c8 == '\0') {
        pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
        pTVar28 = (TCGv_i32)((long)pTVar4 - (long)pTVar1);
        pTVar15 = s->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar15,INDEX_op_ld16u_i32,(TCGArg)((long)pTVar15 + (long)pTVar28),
                            (TCGArg)(pTVar15->cpu_env + (long)pTVar15),
                            (ulong)(srcidx * 0x100 + element * 2 + 0xc10));
        uVar26 = (uint)local_b0;
        iVar9 = 1;
        if ((uVar26 >> 0x1c & 1) == 0) {
          tcg_gen_deposit_i32_aarch64(pTVar1,pTVar28,pTVar28,pTVar28,0x10,0x10);
          uVar26 = (uint)local_b0;
          iVar9 = 2;
        }
        uVar27 = (int)local_a0 * 0x100;
        puVar23 = (undefined1 *)(ulong)(uVar27 + 0xc10);
        local_a0 = CONCAT44(local_a0._4_4_,uVar26) & 0xffffffff0000e000;
        local_c8 = (TCGTemp *)(pTVar28 + (long)pTVar1);
        pTVar4 = (TCGTemp *)(ulong)((int)local_a8 * 0x100 + 0xc10);
        local_90 = (TCGTemp *)((ulong)(uVar26 >> 0x1b & 8 | uVar27) + 0xc10);
        local_a8 = (ulong)(uint)(iVar9 << 2);
        uVar29 = 0;
        local_88 = (code *)(ulong)(uVar24 - 2);
        local_c0 = pTVar4;
        do {
          pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
          if (((uint)local_b0 >> 0x1c & 1) == 0) {
            pTVar15 = local_b8->uc->tcg_ctx;
            a3 = &local_90->field_0x0 + uVar29;
            a2 = pTVar15->cpu_env + (long)pTVar15;
            opc = INDEX_op_ld_i32;
          }
          else {
            pTVar15 = local_b8->uc->tcg_ctx;
            a2 = pTVar15->cpu_env + (long)pTVar15;
            opc = INDEX_op_ld16u_i32;
            a3 = puVar23;
          }
          tcg_gen_op3_aarch64(pTVar15,opc,(long)pTVar15 + ((long)pTVar5 - (long)pTVar1),(TCGArg)a2,
                              (TCGArg)a3);
          pTVar7 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
          lVar25 = (long)pTVar7 - (long)pTVar1;
          *(long *)((long)tcg_res + uVar29 * 2) = lVar25;
          lVar13 = lVar25;
          if ((int)local_a0 != 0xa000) {
            pTVar7 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
            lVar13 = (long)pTVar7 - (long)pTVar1;
          }
          pTVar7 = (TCGTemp *)(((long)pTVar5 - (long)pTVar1) + (long)pTVar1);
          pTVar5 = (TCGTemp *)((long)&pTVar1->pool_cur + lVar13);
          if ((int)o_10 == 0x20000000) {
            pcVar19 = helper_neon_mull_u16_aarch64;
          }
          else {
            pcVar19 = helper_neon_mull_s16_aarch64;
          }
          local_e0 = local_c8;
          local_e8 = pTVar7;
          tcg_gen_callN_aarch64(pTVar1,pcVar19,pTVar5,2,&local_e8);
          pDVar11 = local_b8;
          if (((uint)local_b0 >> 0xc & 1) != 0) {
            local_e8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
            local_e0 = pTVar5;
            local_d8 = pTVar5;
            tcg_gen_callN_aarch64(pTVar1,helper_neon_addl_saturate_s32_aarch64,pTVar5,3,&local_e8);
          }
          tcg_temp_free_internal_aarch64(pTVar1,pTVar7);
          if ((int)local_a0 != 0xa000) {
            pTVar1 = pDVar11->uc->tcg_ctx;
            tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + lVar25,
                                (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(TCGArg)pTVar4);
            if ((uint)local_88 < 6) {
              (*(code *)(&DAT_00d78ca8 + *(int *)(&DAT_00d78ca8 + (long)local_88 * 4)))();
              return;
            }
            iVar9 = 0x35e4;
            goto LAB_006aa79e;
          }
          pTVar4 = (TCGTemp *)&pTVar4->val;
          puVar23 = puVar23 + 2;
          uVar29 = uVar29 + 4;
        } while (local_a8 != uVar29);
        tcg_temp_free_internal_aarch64(pTVar1,local_c8);
        if (((uint)local_b0 >> 0x1c & 1) != 0) {
          tcg_gen_ext32u_i64_aarch64(pTVar1,tcg_res[0],tcg_res[0]);
          goto LAB_006aa6c0;
        }
      }
      else {
        memop = (uint)((uVar8 & 0x20001000) != 0x20000000) * 4 + MO_32;
        local_78 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
        local_98 = (TCGTemp *)((long)local_78 - (long)pTVar1);
        local_88 = (code *)CONCAT44(local_88._4_4_,memop);
        read_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,(TCGv_i64)local_98,srcidx,element,
                         memop);
        local_90 = (TCGTemp *)CONCAT44(local_90._4_4_,uVar18 >> 0x1d);
        local_70 = CONCAT44(local_70._4_4_,(int)local_b0) & 0xffffffff0000e000;
        local_c0 = (TCGTemp *)(ulong)((int)local_a8 * 0x100 + 0xc10);
        ppTVar33 = tcg_res;
        local_60 = (ulong)(uVar24 - 2);
        lVar13 = 0;
        bVar34 = false;
        do {
          uVar29 = local_b0;
          pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
          uVar24 = (uint)local_90 | (uint)lVar13;
          if ((uVar29 & 0x10000000) != 0) {
            uVar24 = 0;
          }
          read_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,
                           (TCGv_i64)((long)pTVar4 - (long)pTVar1),(int)local_a0,uVar24,
                           (MemOp)local_88);
          local_c8 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
          pTVar14 = (TCGv_i64)((long)local_c8 - (long)pTVar1);
          *ppTVar33 = pTVar14;
          iVar9 = (int)local_70;
          pTVar6 = pTVar14;
          if ((int)local_70 != 0xa000) {
            pTVar5 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I64,false);
            pTVar6 = (TCGv_i64)((long)pTVar5 - (long)pTVar1);
          }
          pTVar5 = (TCGTemp *)(pTVar6 + (long)&pTVar1->pool_cur);
          o_10 = (uintptr_t)pTVar6;
          tcg_gen_op3_aarch64(pTVar1,INDEX_op_mul_i64,(TCGArg)pTVar5,(TCGArg)pTVar4,(TCGArg)local_78
                             );
          tcg_temp_free_internal_aarch64
                    (pTVar1,(TCGTemp *)((TCGv_i64)((long)pTVar4 - (long)pTVar1) + (long)pTVar1));
          if (((uint)local_b0 >> 0xc & 1) != 0) {
            local_e8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
            local_e0 = pTVar5;
            local_d8 = pTVar5;
            tcg_gen_callN_aarch64(pTVar1,helper_neon_addl_saturate_s64_aarch64,pTVar5,3,&local_e8);
          }
          pDVar11 = local_b8;
          if (iVar9 != 0xa000) {
            pTVar1 = local_b8->uc->tcg_ctx;
            tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)pTVar14),
                                (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                                (TCGArg)(&local_c0->field_0x0 + lVar13 * 8));
            if ((uint)local_60 < 6) {
              (*(code *)(&DAT_00d78cc0 + *(int *)(&DAT_00d78cc0 + local_60 * 4)))();
              return;
            }
            iVar9 = 0x3597;
            goto LAB_006aa79e;
          }
          uVar24 = (uint)local_b0;
          lVar13 = 1;
          ppTVar33 = tcg_res + 1;
          bVar12 = !bVar34;
          s = local_b8;
          bVar34 = true;
        } while ((local_b0 >> 0x1c & 1) == 0 && bVar12);
        tcg_temp_free_internal_aarch64
                  (pTVar1,(TCGTemp *)((long)&pTVar1->pool_cur + (long)&local_98->field_0x0));
        clear_vec_high((DisasContext_conflict1 *)(ulong)(uint)pDVar11->sve_len,
                       SUB81(pDVar11->uc->tcg_ctx,0),(uint)((uVar24 >> 0x1c & 1) == 0));
        if ((uVar24 >> 0x1c & 1) != 0) {
LAB_006aa6c0:
          tcg_res[1] = tcg_const_i64_aarch64(pTVar1,0);
        }
      }
      pDVar11 = local_b8;
      uVar29 = (ulong)local_c0 & 0xffffffff;
      lVar13 = 0;
      bVar34 = true;
      do {
        bVar12 = bVar34;
        lVar25 = *(long *)((long)tcg_res + lVar13);
        pTVar15 = pDVar11->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar15,INDEX_op_st_i64,(long)&pTVar15->pool_cur + lVar25,
                            (TCGArg)(pTVar15->cpu_env + (long)pTVar15),lVar13 + uVar29);
        tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)((long)&pTVar1->pool_cur + lVar25));
        lVar13 = 8;
        bVar34 = false;
      } while (bVar12);
      goto LAB_006aa739;
    }
    local_90 = (TCGTemp *)CONCAT44(local_90._4_4_,uVar18);
    uVar29 = local_b0 >> 0x1c;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
    pTVar28 = (TCGv_i32)((long)pTVar4 - (long)pTVar1);
    read_vec_element_i32
              ((DisasContext_conflict1 *)s->uc->tcg_ctx,pTVar28,srcidx,element,(MemOp)local_78);
    if ((char)o_10 == '\x01' && (uVar29 & 1) == 0) {
      tcg_gen_deposit_i32_aarch64(pTVar1,pTVar28,pTVar28,pTVar28,0x10,0x10);
    }
    uVar20 = 2;
    if ((local_b0 & 0x10000000) != 0) {
      uVar20 = (int)local_78;
    }
    local_88 = (code *)CONCAT44(local_88._4_4_,uVar20);
    local_70 = (ulong)(uVar18 != 0) * 2 + 2;
    local_c0 = (TCGTemp *)(pTVar28 + (long)pTVar1);
    local_98 = (TCGTemp *)(local_68 + (long)pTVar1);
    pTVar4 = (TCGTemp *)(ulong)((int)local_a8 * 0x100 + 0xc10);
    uVar29 = 0;
    local_60 = (ulong)(uVar27 - 1);
    do {
      local_c8 = pTVar4;
      pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
      tcg_dest = (TCGv_i32)((long)pTVar4 - (long)pTVar1);
      pTVar4 = tcg_temp_new_internal_aarch64(pTVar1,TCG_TYPE_I32,false);
      pTVar28 = (TCGv_i32)((long)pTVar4 - (long)pTVar1);
      iVar9 = (int)uVar29;
      read_vec_element_i32
                ((DisasContext_conflict1 *)local_b8->uc->tcg_ctx,tcg_dest,(int)local_a0,iVar9,
                 (MemOp)local_88);
      uVar2 = o_10;
      pDVar11 = local_b8;
      pTVar4 = local_c8;
      if (uVar27 < 0x19) {
        if ((uint)local_60 < 0x14) {
          (*(code *)(&DAT_00d78c58 + *(int *)(&DAT_00d78c58 + local_60 * 4)))();
          return;
        }
LAB_006aa7b3:
        iVar9 = 0x3542;
        goto LAB_006aa79e;
      }
      if (uVar27 == 0x19) {
        if ((int)local_78 == 2) {
          local_e8 = (TCGTemp *)(tcg_dest + (long)pTVar1);
          local_e0 = local_c0;
          local_d8 = local_98;
          tcg_gen_callN_aarch64
                    (pTVar1,helper_vfp_mulxs_aarch64,(TCGTemp *)((long)pTVar1 + (long)pTVar28),3,
                     &local_e8);
          pDVar11 = local_b8;
          goto LAB_006aa147;
        }
        if ((int)local_78 != 1) {
          iVar9 = 0x3516;
          goto LAB_006aa79e;
        }
        local_e8 = (TCGTemp *)(tcg_dest + (long)pTVar1);
        if (((uint)local_b0 >> 0x1c & 1) == 0) {
          local_e0 = local_c0;
          local_d8 = local_98;
          tcg_gen_callN_aarch64
                    (pTVar1,helper_advsimd_mulx2h_aarch64,(TCGTemp *)((long)pTVar1 + (long)pTVar28),
                     3,&local_e8);
          goto LAB_006aa24a;
        }
        local_e0 = local_c0;
        local_d8 = local_98;
        tcg_gen_callN_aarch64
                  (pTVar1,helper_advsimd_mulxh_aarch64,(TCGTemp *)((long)pTVar1 + (long)pTVar28),3,
                   &local_e8);
LAB_006aa153:
        write_fp_sreg(pDVar11,(int)local_a8,pTVar28);
      }
      else {
        if (uVar27 == 0x1d) {
          read_vec_element_i32
                    ((DisasContext_conflict1 *)local_b8->uc->tcg_ctx,pTVar28,(int)local_a8,iVar9,
                     (MemOp)local_88);
          pTVar4 = local_c8;
          local_e8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
          local_e0 = (TCGTemp *)(tcg_dest + (long)pTVar1);
          local_d0 = (TCGTemp *)((long)pTVar1 + (long)pTVar28);
          if ((char)o_10 == '\0') {
            pcVar19 = helper_neon_qrdmlah_s32_aarch64;
          }
          else {
            pcVar19 = helper_neon_qrdmlah_s16_aarch64;
          }
          local_d8 = local_c0;
          tcg_gen_callN_aarch64(pTVar1,pcVar19,local_d0,4,&local_e8);
        }
        else {
          if (uVar27 != 0x1f) goto LAB_006aa7b3;
          read_vec_element_i32
                    ((DisasContext_conflict1 *)local_b8->uc->tcg_ctx,pTVar28,(int)local_a8,iVar9,
                     (MemOp)local_88);
          local_e8 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
          local_e0 = (TCGTemp *)(tcg_dest + (long)pTVar1);
          local_d0 = (TCGTemp *)((long)pTVar1 + (long)pTVar28);
          if ((char)uVar2 == '\0') {
            pcVar19 = helper_neon_qrdmlsh_s32_aarch64;
          }
          else {
            pcVar19 = helper_neon_qrdmlsh_s16_aarch64;
          }
          local_d8 = local_c0;
          tcg_gen_callN_aarch64(pTVar1,pcVar19,local_d0,4,&local_e8);
          pTVar4 = local_c8;
        }
LAB_006aa147:
        if (((uint)local_b0 >> 0x1c & 1) != 0) goto LAB_006aa153;
LAB_006aa24a:
        pTVar15 = pDVar11->uc->tcg_ctx;
        tcg_gen_op3_aarch64(pTVar15,INDEX_op_st_i32,(TCGArg)((long)pTVar15 + (long)pTVar28),
                            (TCGArg)(pTVar15->cpu_env + (long)pTVar15),(TCGArg)pTVar4);
      }
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(tcg_dest + (long)pTVar1));
      tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(pTVar28 + (long)pTVar1));
      if (((uint)local_b0 >> 0x1c & 1) != 0) break;
      uVar29 = uVar29 + 1;
      pTVar4 = (TCGTemp *)&pTVar4->field_0x4;
    } while (uVar29 < local_70);
    bVar34 = (uint)local_90 != 0;
    pTVar4 = local_c0;
  }
  tcg_temp_free_internal_aarch64(pTVar1,pTVar4);
  clear_vec_high((DisasContext_conflict1 *)(ulong)(uint)local_b8->sve_len,
                 SUB81(local_b8->uc->tcg_ctx,0),(uint)bVar34);
LAB_006aa739:
  if (local_68 != (TCGv_ptr)0x0) {
    tcg_temp_free_internal_aarch64(pTVar1,(TCGTemp *)(local_68 + (long)pTVar1));
  }
  return;
}

Assistant:

static void disas_simd_indexed(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* This encoding has two kinds of instruction:
     *  normal, where we perform elt x idxelt => elt for each
     *     element in the vector
     *  long, where we perform elt x idxelt and generate a result of
     *     double the width of the input element
     * The long ops have a 'part' specifier (ie come in INSN, INSN2 pairs).
     */
    bool is_scalar = extract32(insn, 28, 1);
    bool is_q = extract32(insn, 30, 1);
    bool u = extract32(insn, 29, 1);
    int size = extract32(insn, 22, 2);
    int l = extract32(insn, 21, 1);
    int m = extract32(insn, 20, 1);
    /* Note that the Rm field here is only 4 bits, not 5 as it usually is */
    int rm = extract32(insn, 16, 4);
    int opcode = extract32(insn, 12, 4);
    int h = extract32(insn, 11, 1);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    bool is_long = false;
    int is_fp = 0;
    bool is_fp16 = false;
    int index;
    TCGv_ptr fpst;

    switch (16 * u + opcode) {
    case 0x08: /* MUL */
    case 0x10: /* MLA */
    case 0x14: /* MLS */
        if (is_scalar) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x02: /* SMLAL, SMLAL2 */
    case 0x12: /* UMLAL, UMLAL2 */
    case 0x06: /* SMLSL, SMLSL2 */
    case 0x16: /* UMLSL, UMLSL2 */
    case 0x0a: /* SMULL, SMULL2 */
    case 0x1a: /* UMULL, UMULL2 */
        if (is_scalar) {
            unallocated_encoding(s);
            return;
        }
        is_long = true;
        break;
    case 0x03: /* SQDMLAL, SQDMLAL2 */
    case 0x07: /* SQDMLSL, SQDMLSL2 */
    case 0x0b: /* SQDMULL, SQDMULL2 */
        is_long = true;
        break;
    case 0x0c: /* SQDMULH */
    case 0x0d: /* SQRDMULH */
        break;
    case 0x01: /* FMLA */
    case 0x05: /* FMLS */
    case 0x09: /* FMUL */
    case 0x19: /* FMULX */
        is_fp = 1;
        break;
    case 0x1d: /* SQRDMLAH */
    case 0x1f: /* SQRDMLSH */
        if (!dc_isar_feature(aa64_rdm, s)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x0e: /* SDOT */
    case 0x1e: /* UDOT */
        if (is_scalar || size != MO_32 || !dc_isar_feature(aa64_dp, s)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x11: /* FCMLA #0 */
    case 0x13: /* FCMLA #90 */
    case 0x15: /* FCMLA #180 */
    case 0x17: /* FCMLA #270 */
        if (is_scalar || !dc_isar_feature(aa64_fcma, s)) {
            unallocated_encoding(s);
            return;
        }
        is_fp = 2;
        break;
    case 0x00: /* FMLAL */
    case 0x04: /* FMLSL */
    case 0x18: /* FMLAL2 */
    case 0x1c: /* FMLSL2 */
        if (is_scalar || size != MO_32 || !dc_isar_feature(aa64_fhm, s)) {
            unallocated_encoding(s);
            return;
        }
        size = MO_16;
        /* is_fp, but we pass tcg_ctx->cpu_env not fp_status.  */
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    switch (is_fp) {
    case 1: /* normal fp */
        /* convert insn encoded size to MemOp size */
        switch (size) {
        case 0: /* half-precision */
            size = MO_16;
            is_fp16 = true;
            break;
        case MO_32: /* single precision */
        case MO_64: /* double precision */
            break;
        default:
            unallocated_encoding(s);
            return;
        }
        break;

    case 2: /* complex fp */
        /* Each indexable element is a complex pair.  */
        size += 1;
        switch (size) {
        case MO_32:
            if (h && !is_q) {
                unallocated_encoding(s);
                return;
            }
            is_fp16 = true;
            break;
        case MO_64:
            break;
        default:
            unallocated_encoding(s);
            return;
        }
        break;

    default: /* integer */
        switch (size) {
        case MO_8:
        case MO_64:
            unallocated_encoding(s);
            return;
        }
        break;
    }
    if (is_fp16 && !dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
        return;
    }

    /* Given MemOp size, adjust register and indexing.  */
    switch (size) {
    case MO_16:
        index = h << 2 | l << 1 | m;
        break;
    case MO_32:
        index = h << 1 | l;
        rm |= m << 4;
        break;
    case MO_64:
        if (l || !is_q) {
            unallocated_encoding(s);
            return;
        }
        index = h;
        rm |= m << 4;
        break;
    default:
        g_assert_not_reached();
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_fp) {
        fpst = get_fpstatus_ptr(tcg_ctx, is_fp16);
    } else {
        fpst = NULL;
    }

    switch (16 * u + opcode) {
    case 0x0e: /* SDOT */
    case 0x1e: /* UDOT */
        gen_gvec_op3_ool(s, is_q, rd, rn, rm, index,
                         u ? gen_helper_gvec_udot_idx_b
                         : gen_helper_gvec_sdot_idx_b);
        return;
    case 0x11: /* FCMLA #0 */
    case 0x13: /* FCMLA #90 */
    case 0x15: /* FCMLA #180 */
    case 0x17: /* FCMLA #270 */
        {
            int rot = extract32(insn, 13, 2);
            int data = (index << 2) | rot;
            tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                               vec_full_reg_offset(s, rn),
                               vec_full_reg_offset(s, rm), fpst,
                               is_q ? 16 : 8, vec_full_reg_size(s), data,
                               size == MO_64
                               ? gen_helper_gvec_fcmlas_idx
                               : gen_helper_gvec_fcmlah_idx);
            tcg_temp_free_ptr(tcg_ctx, fpst);
        }
        return;

    case 0x00: /* FMLAL */
    case 0x04: /* FMLSL */
    case 0x18: /* FMLAL2 */
    case 0x1c: /* FMLSL2 */
        {
            int is_s = extract32(opcode, 2, 1);
            int is_2 = u;
            int data = (index << 2) | (is_2 << 1) | is_s;
            tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                               vec_full_reg_offset(s, rn),
                               vec_full_reg_offset(s, rm), tcg_ctx->cpu_env,
                               is_q ? 16 : 8, vec_full_reg_size(s),
                               data, gen_helper_gvec_fmlal_idx_a64);
        }
        return;
    }

    if (size == 3) {
        TCGv_i64 tcg_idx = tcg_temp_new_i64(tcg_ctx);
        int pass;

        assert(is_fp && is_q && !is_long);

        read_vec_element(s, tcg_idx, rm, index, MO_64);

        for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
            TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 tcg_res = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_op, rn, pass, MO_64);

            switch (16 * u + opcode) {
            case 0x05: /* FMLS */
                /* As usual for ARM, separate negation for fused multiply-add */
                gen_helper_vfp_negd(tcg_ctx, tcg_op, tcg_op);
                /* fall through */
            case 0x01: /* FMLA */
                read_vec_element(s, tcg_res, rd, pass, MO_64);
                gen_helper_vfp_muladdd(tcg_ctx, tcg_res, tcg_op, tcg_idx, tcg_res, fpst);
                break;
            case 0x09: /* FMUL */
                gen_helper_vfp_muld(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                break;
            case 0x19: /* FMULX */
                gen_helper_vfp_mulxd(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            write_vec_element(s, tcg_res, rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_op);
            tcg_temp_free_i64(tcg_ctx, tcg_res);
        }

        tcg_temp_free_i64(tcg_ctx, tcg_idx);
        clear_vec_high(s, !is_scalar, rd);
    } else if (!is_long) {
        /* 32 bit floating point, or 16 or 32 bit integer.
         * For the 16 bit scalar case we use the usual Neon helpers and
         * rely on the fact that 0 op 0 == 0 with no side effects.
         */
        TCGv_i32 tcg_idx = tcg_temp_new_i32(tcg_ctx);
        int pass, maxpasses;

        if (is_scalar) {
            maxpasses = 1;
        } else {
            maxpasses = is_q ? 4 : 2;
        }

        read_vec_element_i32(s, tcg_idx, rm, index, size);

        if (size == 1 && !is_scalar) {
            /* The simplest way to handle the 16x16 indexed ops is to duplicate
             * the index into both halves of the 32 bit tcg_idx and then use
             * the usual Neon helpers.
             */
            tcg_gen_deposit_i32(tcg_ctx, tcg_idx, tcg_idx, tcg_idx, 16, 16);
        }

        for (pass = 0; pass < maxpasses; pass++) {
            TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op, rn, pass, is_scalar ? size : MO_32);

            switch (16 * u + opcode) {
            case 0x08: /* MUL */
            case 0x10: /* MLA */
            case 0x14: /* MLS */
            {
                static NeonGenTwoOpFn * const fns[2][2] = {
                    { gen_helper_neon_add_u16, gen_helper_neon_sub_u16 },
                    { tcg_gen_add_i32, tcg_gen_sub_i32 },
                };
                NeonGenTwoOpFn *genfn;
                bool is_sub = opcode == 0x4;

                if (size == 1) {
                    gen_helper_neon_mul_u16(tcg_ctx, tcg_res, tcg_op, tcg_idx);
                } else {
                    tcg_gen_mul_i32(tcg_ctx, tcg_res, tcg_op, tcg_idx);
                }
                if (opcode == 0x8) {
                    break;
                }
                read_vec_element_i32(s, tcg_op, rd, pass, MO_32);
                genfn = fns[size - 1][is_sub];
                genfn(tcg_ctx, tcg_res, tcg_op, tcg_res);
                break;
            }
            case 0x05: /* FMLS */
            case 0x01: /* FMLA */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                switch (size) {
                case 1:
                    if (opcode == 0x5) {
                        /* As usual for ARM, separate negation for fused
                         * multiply-add */
                        tcg_gen_xori_i32(tcg_ctx, tcg_op, tcg_op, 0x80008000);
                    }
                    if (is_scalar) {
                        gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                                   tcg_res, fpst);
                    } else {
                        gen_helper_advsimd_muladd2h(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                                    tcg_res, fpst);
                    }
                    break;
                case 2:
                    if (opcode == 0x5) {
                        /* As usual for ARM, separate negation for
                         * fused multiply-add */
                        tcg_gen_xori_i32(tcg_ctx, tcg_op, tcg_op, 0x80000000);
                    }
                    gen_helper_vfp_muladds(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                           tcg_res, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x09: /* FMUL */
                switch (size) {
                case 1:
                    if (is_scalar) {
                        gen_helper_advsimd_mulh(tcg_ctx, tcg_res, tcg_op,
                                                tcg_idx, fpst);
                    } else {
                        gen_helper_advsimd_mul2h(tcg_ctx, tcg_res, tcg_op,
                                                 tcg_idx, fpst);
                    }
                    break;
                case 2:
                    gen_helper_vfp_muls(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x19: /* FMULX */
                switch (size) {
                case 1:
                    if (is_scalar) {
                        gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op,
                                                 tcg_idx, fpst);
                    } else {
                        gen_helper_advsimd_mulx2h(tcg_ctx, tcg_res, tcg_op,
                                                  tcg_idx, fpst);
                    }
                    break;
                case 2:
                    gen_helper_vfp_mulxs(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x0c: /* SQDMULH */
                if (size == 1) {
                    gen_helper_neon_qdmulh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                               tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_qdmulh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                               tcg_op, tcg_idx);
                }
                break;
            case 0x0d: /* SQRDMULH */
                if (size == 1) {
                    gen_helper_neon_qrdmulh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_qrdmulh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx);
                }
                break;
            case 0x1d: /* SQRDMLAH */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                if (size == 1) {
                    gen_helper_neon_qrdmlah_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                } else {
                    gen_helper_neon_qrdmlah_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                }
                break;
            case 0x1f: /* SQRDMLSH */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                if (size == 1) {
                    gen_helper_neon_qrdmlsh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                } else {
                    gen_helper_neon_qrdmlsh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                }
                break;
            default:
                g_assert_not_reached();
            }

            if (is_scalar) {
                write_fp_sreg(s, rd, tcg_res);
            } else {
                write_vec_element_i32(s, tcg_res, rd, pass, MO_32);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op);
            tcg_temp_free_i32(tcg_ctx, tcg_res);
        }

        tcg_temp_free_i32(tcg_ctx, tcg_idx);
        clear_vec_high(s, is_q, rd);
    } else {
        /* long ops: 16x16->32 or 32x32->64 */
        TCGv_i64 tcg_res[2];
        int pass;
        bool satop = extract32(opcode, 0, 1);
        MemOp memop = MO_32;

        if (satop || !u) {
            memop |= MO_SIGN;
        }

        if (size == 2) {
            TCGv_i64 tcg_idx = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_idx, rm, index, memop);

            for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
                TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
                TCGv_i64 tcg_passres;
                int passelt;

                if (is_scalar) {
                    passelt = 0;
                } else {
                    passelt = pass + (is_q * 2);
                }

                read_vec_element(s, tcg_op, rn, passelt, memop);

                tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

                if (opcode == 0xa || opcode == 0xb) {
                    /* Non-accumulating ops */
                    tcg_passres = tcg_res[pass];
                } else {
                    tcg_passres = tcg_temp_new_i64(tcg_ctx);
                }

                tcg_gen_mul_i64(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                tcg_temp_free_i64(tcg_ctx, tcg_op);

                if (satop) {
                    /* saturating, doubling */
                    gen_helper_neon_addl_saturate_s64(tcg_ctx, tcg_passres, tcg_ctx->cpu_env,
                                                      tcg_passres, tcg_passres);
                }

                if (opcode == 0xa || opcode == 0xb) {
                    continue;
                }

                /* Accumulating op: handle accumulate step */
                read_vec_element(s, tcg_res[pass], rd, pass, MO_64);

                switch (opcode) {
                case 0x2: /* SMLAL, SMLAL2, UMLAL, UMLAL2 */
                    tcg_gen_add_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_passres);
                    break;
                case 0x6: /* SMLSL, SMLSL2, UMLSL, UMLSL2 */
                    tcg_gen_sub_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_passres);
                    break;
                case 0x7: /* SQDMLSL, SQDMLSL2 */
                    tcg_gen_neg_i64(tcg_ctx, tcg_passres, tcg_passres);
                    /* fall through */
                case 0x3: /* SQDMLAL, SQDMLAL2 */
                    gen_helper_neon_addl_saturate_s64(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env,
                                                      tcg_res[pass],
                                                      tcg_passres);
                    break;
                default:
                    g_assert_not_reached();
                }
                tcg_temp_free_i64(tcg_ctx, tcg_passres);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_idx);

            clear_vec_high(s, !is_scalar, rd);
        } else {
            TCGv_i32 tcg_idx = tcg_temp_new_i32(tcg_ctx);

            assert(size == 1);
            read_vec_element_i32(s, tcg_idx, rm, index, size);

            if (!is_scalar) {
                /* The simplest way to handle the 16x16 indexed ops is to
                 * duplicate the index into both halves of the 32 bit tcg_idx
                 * and then use the usual Neon helpers.
                 */
                tcg_gen_deposit_i32(tcg_ctx, tcg_idx, tcg_idx, tcg_idx, 16, 16);
            }

            for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
                TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
                TCGv_i64 tcg_passres;

                if (is_scalar) {
                    read_vec_element_i32(s, tcg_op, rn, pass, size);
                } else {
                    read_vec_element_i32(s, tcg_op, rn,
                                         pass + (is_q * 2), MO_32);
                }

                tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

                if (opcode == 0xa || opcode == 0xb) {
                    /* Non-accumulating ops */
                    tcg_passres = tcg_res[pass];
                } else {
                    tcg_passres = tcg_temp_new_i64(tcg_ctx);
                }

                if (memop & MO_SIGN) {
                    gen_helper_neon_mull_s16(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_mull_u16(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                }
                if (satop) {
                    gen_helper_neon_addl_saturate_s32(tcg_ctx, tcg_passres, tcg_ctx->cpu_env,
                                                      tcg_passres, tcg_passres);
                }
                tcg_temp_free_i32(tcg_ctx, tcg_op);

                if (opcode == 0xa || opcode == 0xb) {
                    continue;
                }

                /* Accumulating op: handle accumulate step */
                read_vec_element(s, tcg_res[pass], rd, pass, MO_64);

                switch (opcode) {
                case 0x2: /* SMLAL, SMLAL2, UMLAL, UMLAL2 */
                    gen_helper_neon_addl_u32(tcg_ctx, tcg_res[pass], tcg_res[pass],
                                             tcg_passres);
                    break;
                case 0x6: /* SMLSL, SMLSL2, UMLSL, UMLSL2 */
                    gen_helper_neon_subl_u32(tcg_ctx, tcg_res[pass], tcg_res[pass],
                                             tcg_passres);
                    break;
                case 0x7: /* SQDMLSL, SQDMLSL2 */
                    gen_helper_neon_negl_u32(tcg_ctx, tcg_passres, tcg_passres);
                    /* fall through */
                case 0x3: /* SQDMLAL, SQDMLAL2 */
                    gen_helper_neon_addl_saturate_s32(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env,
                                                      tcg_res[pass],
                                                      tcg_passres);
                    break;
                default:
                    g_assert_not_reached();
                }
                tcg_temp_free_i64(tcg_ctx, tcg_passres);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_idx);

            if (is_scalar) {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_res[0], tcg_res[0]);
            }
        }

        if (is_scalar) {
            tcg_res[1] = tcg_const_i64(tcg_ctx, 0);
        }

        for (pass = 0; pass < 2; pass++) {
            write_vec_element(s, tcg_res[pass], rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_res[pass]);
        }
    }

    if (fpst) {
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }
}